

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg * __thiscall
fmt::v5::
basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::do_get(format_arg *__return_storage_ptr__,
        basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *this,size_type index)

{
  type tVar1;
  value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *pvVar2;
  value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *val;
  unsigned_long_long num_args;
  longlong signed_types;
  size_type index_local;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *this_local;
  
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  ::basic_format_arg(__return_storage_ptr__);
  if ((long)this->types_ < 0) {
    if ((ulong)index < -this->types_) {
      pvVar2 = (this->field_1).values_ + (ulong)index * 2;
      (__return_storage_ptr__->value_).field_0.long_long_value = (pvVar2->field_0).long_long_value;
      (__return_storage_ptr__->value_).field_0.string.size = (pvVar2->field_0).string.size;
      __return_storage_ptr__->type_ = pvVar2[1].field_0.int_value;
    }
  }
  else if (index < 0x10) {
    tVar1 = type(this,index);
    __return_storage_ptr__->type_ = tVar1;
    if (__return_storage_ptr__->type_ != none_type) {
      pvVar2 = (this->field_1).values_;
      (__return_storage_ptr__->value_).field_0.long_long_value =
           pvVar2[index].field_0.long_long_value;
      (__return_storage_ptr__->value_).field_0.string.size = pvVar2[index].field_0.string.size;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

format_arg do_get(size_type index) const {
    format_arg arg;
    long long signed_types = static_cast<long long>(types_);
    if (signed_types < 0) {
      unsigned long long num_args =
          static_cast<unsigned long long>(-signed_types);
      if (index < num_args)
        arg = args_[index];
      return arg;
    }
    if (index > internal::max_packed_args)
      return arg;
    arg.type_ = type(index);
    if (arg.type_ == internal::none_type)
      return arg;
    internal::value<Context> &val = arg.value_;
    val = values_[index];
    return arg;
  }